

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O1

void tls_thread(void *arg)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  void *pvVar4;
  pthread_t __th;
  ulong uVar5;
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  uv_key_t *puVar6;
  int iVar7;
  code **ppcVar8;
  code **ppcVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  undefined1 *puVar16;
  undefined1 *puVar17;
  undefined1 *puVar18;
  undefined1 *puVar19;
  undefined1 *puVar20;
  undefined1 *puVar21;
  long lVar22;
  undefined1 auStack_90 [8];
  undefined4 auStack_88 [2];
  code *pcStack_80;
  ulong uStack_78;
  rlimit64 rStack_70;
  pthread_attr_t pStack_60;
  code *pcStack_28;
  code *apcStack_20 [2];
  
  apcStack_20[0] = (code *)0x1755c2;
  lVar3 = uv_key_get(&tls_key);
  if (lVar3 == 0) {
    apcStack_20[0] = (code *)0x1755d9;
    uv_key_set(&tls_key,arg);
    apcStack_20[0] = (code *)0x1755e1;
    pvVar4 = (void *)uv_key_get(&tls_key);
    if (pvVar4 != arg) goto LAB_00175611;
    puVar6 = &tls_key;
    apcStack_20[0] = (code *)0x1755f7;
    uv_key_set(&tls_key,0);
    apcStack_20[0] = (code *)0x1755ff;
    lVar3 = uv_key_get(&tls_key);
    if (lVar3 == 0) {
      return;
    }
  }
  else {
    apcStack_20[0] = (code *)0x175611;
    tls_thread_cold_1();
LAB_00175611:
    apcStack_20[0] = (code *)0x175616;
    tls_thread_cold_2();
    puVar6 = (uv_key_t *)arg;
  }
  apcStack_20[0] = run_test_thread_stack_size;
  tls_thread_cold_3();
  ppcVar8 = apcStack_20;
  ppcVar9 = apcStack_20;
  pcStack_28 = (code *)0x17562d;
  iVar2 = uv_thread_create(apcStack_20,thread_check_stack,0);
  if (iVar2 == 0) {
    pcStack_28 = (code *)0x175639;
    iVar2 = uv_thread_join();
    ppcVar8 = ppcVar9;
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_28 = (code *)0x175646;
    run_test_thread_stack_size_cold_1();
  }
  pcStack_28 = thread_check_stack;
  run_test_thread_stack_size_cold_2();
  pcStack_80 = (code *)0x175662;
  pcStack_28 = (code *)puVar6;
  iVar2 = getrlimit64(RLIMIT_STACK,&rStack_70);
  if (iVar2 == 0) {
    if (rStack_70.rlim_cur == 0xffffffffffffffff) {
      rStack_70.rlim_cur = 0x200000;
    }
    pcStack_80 = (code *)0x17567c;
    __th = pthread_self();
    pcStack_80 = (code *)0x175689;
    iVar2 = pthread_getattr_np(__th,&pStack_60);
    if (iVar2 != 0) goto LAB_001756d4;
    pcStack_80 = (code *)0x17569a;
    iVar2 = pthread_attr_getstacksize(&pStack_60,&uStack_78);
    if (iVar2 != 0) goto LAB_001756d9;
    if (ppcVar8 == (code **)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ulong *)((long)ppcVar8 + 8);
    }
    if (uVar5 == 0) {
      uVar5 = rStack_70.rlim_cur;
    }
    if (uStack_78 < uVar5) goto LAB_001756de;
    pcStack_80 = (code *)0x1756c5;
    iVar2 = pthread_attr_destroy(&pStack_60);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_80 = (code *)0x1756d4;
    thread_check_stack_cold_1();
LAB_001756d4:
    pcStack_80 = (code *)0x1756d9;
    thread_check_stack_cold_2();
LAB_001756d9:
    pcStack_80 = (code *)0x1756de;
    thread_check_stack_cold_3();
LAB_001756de:
    pcStack_80 = (code *)0x1756e3;
    thread_check_stack_cold_5();
  }
  pcStack_80 = run_test_thread_stack_size_explicit;
  thread_check_stack_cold_4();
  puVar10 = auStack_90;
  puVar11 = auStack_90;
  puVar12 = auStack_90;
  puVar17 = auStack_90;
  puVar13 = auStack_90;
  puVar18 = auStack_90;
  puVar14 = auStack_90;
  puVar19 = auStack_90;
  puVar15 = auStack_90;
  puVar20 = auStack_90;
  puVar16 = auStack_90;
  puVar21 = auStack_90;
  auStack_88[0] = 1;
  pcStack_80 = (code *)0x100000;
  iVar2 = uv_thread_create_ex(auStack_90,auStack_88,thread_check_stack);
  if (iVar2 == 0) {
    iVar2 = uv_thread_join();
    puVar10 = puVar11;
    if (iVar2 != 0) goto LAB_00175859;
    pcStack_80 = (code *)0x800000;
    iVar2 = uv_thread_create_ex(auStack_90,auStack_88,thread_check_stack);
    puVar10 = puVar12;
    if (iVar2 != 0) goto LAB_0017585e;
    iVar2 = uv_thread_join();
    if (iVar2 != 0) goto LAB_00175863;
    pcStack_80 = (code *)0x0;
    iVar2 = uv_thread_create_ex(auStack_90,auStack_88,thread_check_stack);
    puVar17 = puVar13;
    if (iVar2 != 0) goto LAB_00175868;
    iVar2 = uv_thread_join();
    if (iVar2 != 0) goto LAB_0017586d;
    lVar3 = __sysconf(0x4b);
    pcStack_80 = (code *)(lVar3 + -0x2a);
    iVar2 = uv_thread_create_ex(auStack_90,auStack_88,thread_check_stack);
    puVar18 = puVar14;
    if (iVar2 != 0) goto LAB_00175872;
    iVar2 = uv_thread_join();
    if (iVar2 != 0) goto LAB_00175877;
    lVar3 = __sysconf(0x4b);
    pcStack_80 = (code *)(lVar3 / 2 + -0x2a);
    iVar2 = uv_thread_create_ex(auStack_90,auStack_88,thread_check_stack);
    puVar19 = puVar15;
    if (iVar2 != 0) goto LAB_0017587c;
    iVar2 = uv_thread_join();
    if (iVar2 != 0) goto LAB_00175881;
    pcStack_80 = (code *)0x12d687;
    iVar2 = uv_thread_create_ex(auStack_90,auStack_88,thread_check_stack);
    puVar20 = puVar16;
    if (iVar2 == 0) {
      iVar2 = uv_thread_join();
      if (iVar2 == 0) {
        return;
      }
      goto LAB_0017588b;
    }
  }
  else {
    run_test_thread_stack_size_explicit_cold_1();
LAB_00175859:
    run_test_thread_stack_size_explicit_cold_2();
LAB_0017585e:
    puVar17 = puVar10;
    run_test_thread_stack_size_explicit_cold_3();
LAB_00175863:
    run_test_thread_stack_size_explicit_cold_4();
LAB_00175868:
    puVar18 = puVar17;
    run_test_thread_stack_size_explicit_cold_5();
LAB_0017586d:
    run_test_thread_stack_size_explicit_cold_6();
LAB_00175872:
    puVar19 = puVar18;
    run_test_thread_stack_size_explicit_cold_7();
LAB_00175877:
    run_test_thread_stack_size_explicit_cold_8();
LAB_0017587c:
    puVar20 = puVar19;
    run_test_thread_stack_size_explicit_cold_9();
LAB_00175881:
    run_test_thread_stack_size_explicit_cold_10();
  }
  puVar21 = puVar20;
  run_test_thread_stack_size_explicit_cold_11();
LAB_0017588b:
  run_test_thread_stack_size_explicit_cold_12();
  lVar3 = *(long *)(puVar21 + 0x10);
  iVar2 = uv_getaddrinfo(lVar3,puVar21 + 0x18,getaddrinfo_cb,"localhost",0,0,extraout_RAX);
  if (iVar2 == 0) {
    return;
  }
  getaddrinfo_do_cold_1();
  lVar22 = *(long *)(lVar3 + 0x10);
  lVar3 = lVar3 + 0x18;
  iVar2 = uv_fs_stat(lVar22,lVar3,".",fs_cb);
  iVar7 = (int)lVar3;
  if (iVar2 == 0) {
    return;
  }
  fs_do_cold_1();
  if (iVar7 != 0) {
    getaddrinfo_cb_cold_1();
    uv_fs_req_cleanup();
    piVar1 = (int *)(lVar22 + -0x10);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      fs_do((fs_req *)(lVar22 + -0x18));
      return;
    }
    return;
  }
  uv_freeaddrinfo(extraout_RDX);
  piVar1 = (int *)(lVar22 + -0x10);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    getaddrinfo_do((getaddrinfo_req *)(lVar22 + -0x18));
    return;
  }
  return;
}

Assistant:

static void tls_thread(void* arg) {
  ASSERT(NULL == uv_key_get(&tls_key));
  uv_key_set(&tls_key, arg);
  ASSERT(arg == uv_key_get(&tls_key));
  uv_key_set(&tls_key, NULL);
  ASSERT(NULL == uv_key_get(&tls_key));
}